

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O2

void __thiscall adios2::helper::DimsArray::DimsArray(DimsArray *this,DimsArray *d1)

{
  size_t *__s;
  size_t sVar1;
  
  __s = this->Dimensions;
  (this->super_CoreDims).DimCount = (d1->super_CoreDims).DimCount;
  (this->super_CoreDims).DimensSpan = __s;
  memset(__s,0,0x100);
  sVar1 = (d1->super_CoreDims).DimCount;
  if (sVar1 != 0) {
    memmove(__s,(d1->super_CoreDims).DimensSpan,sVar1 << 3);
    return;
  }
  return;
}

Assistant:

DimsArray(const DimsArray &d1) : CoreDims(d1.size(), &Dimensions[0])
    {
        std::copy(d1.begin(), d1.end(), &Dimensions[0]);
    }